

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderImageLoadStoreTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::image_atomic
               (NegativeTestContext *ctx,TextureType imageType)

{
  MemoryQualifier memory;
  long lVar1;
  long lVar2;
  allocator<char> local_a9;
  long local_a8;
  long local_a0;
  string local_98;
  TextureFormat local_78 [9];
  
  local_78[0].order = RGBA;
  local_78[0].type = SIGNED_INT32;
  local_78[1].order = RGBA;
  local_78[1].type = SIGNED_INT16;
  local_78[2].order = RGBA;
  local_78[2].type = SIGNED_INT8;
  local_78[3].order = R;
  local_78[3].type = SIGNED_INT32;
  local_78[4].order = RGBA;
  local_78[4].type = UNSIGNED_INT32;
  local_78[5].order = RGBA;
  local_78[5].type = UNSIGNED_INT16;
  local_78[6].order = RGBA;
  local_78[6].type = UNSIGNED_INT8;
  local_78[7].order = R;
  local_78[7].type = UNSIGNED_INT32;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,
             "It is an error to pass a writeonly and/or readonly image to imageAtomic*.",&local_a9);
  NegativeTestContext::beginSection(ctx,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  lVar2 = 0;
  while (lVar2 != 3) {
    memory = (&DAT_018ca15c)[lVar2];
    lVar1 = 0;
    local_a8 = lVar2;
    while (lVar1 != 8) {
      local_a0 = lVar1;
      for (lVar2 = 0; lVar2 != 0x1c; lVar2 = lVar2 + 4) {
        testShader(ctx,*(ImageOperation *)((long)&DAT_018ca140 + lVar2),memory,imageType,
                   local_78 + lVar1);
      }
      lVar1 = local_a0 + 1;
    }
    lVar2 = local_a8 + 1;
  }
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void image_atomic (NegativeTestContext& ctx, glu::TextureTestUtil::TextureType imageType)
{
	const tcu::TextureFormat formats[] =
	{
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SIGNED_INT16),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SIGNED_INT8),
		tcu::TextureFormat(tcu::TextureFormat::R,		tcu::TextureFormat::SIGNED_INT32),

		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT16),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT8),
		tcu::TextureFormat(tcu::TextureFormat::R,		tcu::TextureFormat::UNSIGNED_INT32)
	};

	const MemoryQualifier memoryOptions[] =
	{
		MEMORY_READONLY,
		MEMORY_WRITEONLY,
		MEMORY_BOTH
	};

	const ImageOperation imageOperations[] =
	{
		IMAGE_OPERATION_ATOMIC_ADD,
		IMAGE_OPERATION_ATOMIC_MIN,
		IMAGE_OPERATION_ATOMIC_MAX,
		IMAGE_OPERATION_ATOMIC_AND,
		IMAGE_OPERATION_ATOMIC_OR,
		IMAGE_OPERATION_ATOMIC_XOR,
		IMAGE_OPERATION_ATOMIC_COMP_SWAP
	};

	ctx.beginSection("It is an error to pass a writeonly and/or readonly image to imageAtomic*.");
	for (int memoryNdx = 0; memoryNdx < DE_LENGTH_OF_ARRAY(memoryOptions); ++memoryNdx)
	{
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(formats); ++fmtNdx)
		{
			for (int functionNdx = 0; functionNdx < DE_LENGTH_OF_ARRAY(imageOperations); ++functionNdx)
			{
				testShader(ctx, imageOperations[functionNdx], memoryOptions[memoryNdx], imageType, formats[fmtNdx]);
			}
		}
	}
	ctx.endSection();
}